

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvereal.hpp
# Opt level: O3

void __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::_storeSolutionReal
          (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,bool verify)

{
  SolBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pVVar1;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_01;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pVVar2;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_02;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pVVar3;
  SPxStatus SVar4;
  SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar5;
  double dVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  int32_t iVar14;
  int iVar15;
  cpp_dec_float<50U,_int,_void> *pcVar16;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  Status SVar17;
  byte bVar18;
  char cVar19;
  byte bVar20;
  byte bVar21;
  cpp_dec_float<50U,_int,_void> local_d8;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_98;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_90;
  cpp_dec_float<50U,_int,_void> local_68;
  
  DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
  ::reSize(&this->_basisStatusRows,
           (this->_realLP->
           super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).
           super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .set.thenum);
  DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
  ::reSize(&this->_basisStatusCols,
           (this->_realLP->
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).
           super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .set.thenum);
  this_00 = &this->_solReal;
  std::
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ::resize((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            *)this_00,
           (long)(this->_solver).
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thenum);
  pVVar1 = &(this->_solReal)._slacks;
  std::
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ::resize(&pVVar1->val,
           (long)(this->_solver).
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thenum);
  this_01 = &(this->_solReal)._dual;
  std::
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ::resize(&this_01->val,
           (long)(this->_solver).
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thenum);
  pVVar2 = &(this->_solReal)._redCost;
  std::
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ::resize(&pVVar2->val,
           (long)(this->_solver).
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thenum);
  SVar17 = this->_status;
  if (SVar17 == OPTIMAL) {
    SVar17 = OPTIMAL;
    bVar20 = 1;
  }
  else {
    SVar4 = (this->_solver).
            super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .thestatus;
    if ((SVar4 == UNBOUNDED) || (SVar4 == PRIMAL)) {
      local_d8.data._M_elems._32_8_ =
           *(undefined8 *)((this->_solver).theShift.m_backend.data._M_elems + 8);
      local_d8.data._M_elems._0_8_ = *(undefined8 *)(this->_solver).theShift.m_backend.data._M_elems
      ;
      local_d8.data._M_elems._8_8_ =
           *(undefined8 *)((this->_solver).theShift.m_backend.data._M_elems + 2);
      local_d8.data._M_elems._16_8_ =
           *(undefined8 *)((this->_solver).theShift.m_backend.data._M_elems + 4);
      local_d8.data._M_elems._24_8_ =
           *(undefined8 *)((this->_solver).theShift.m_backend.data._M_elems + 6);
      local_d8.exp = (this->_solver).theShift.m_backend.exp;
      local_d8.neg = (this->_solver).theShift.m_backend.neg;
      local_d8.fpclass = (this->_solver).theShift.m_backend.fpclass;
      local_d8.prec_elem = (this->_solver).theShift.m_backend.prec_elem;
      bVar20 = 0;
      if ((local_d8.fpclass != cpp_dec_float_NaN) &&
         (dVar6 = this->_currentSettings->_realParamValues[2] * 10.0, bVar20 = 0, !NAN(dVar6))) {
        local_68.fpclass = cpp_dec_float_finite;
        local_68.prec_elem = 10;
        local_68.data._M_elems[0] = 0;
        local_68.data._M_elems[1] = 0;
        local_68.data._M_elems[2] = 0;
        local_68.data._M_elems[3] = 0;
        local_68.data._M_elems[4] = 0;
        local_68.data._M_elems[5] = 0;
        local_68.data._M_elems._24_5_ = 0;
        local_68.data._M_elems[7]._1_3_ = 0;
        local_68.data._M_elems._32_5_ = 0;
        local_68.data._M_elems[9]._1_3_ = 0;
        local_68.exp = 0;
        local_68.neg = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&local_68,dVar6);
        iVar15 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&local_d8,&local_68);
        bVar20 = (byte)((uint)iVar15 >> 0x1f);
        SVar17 = this->_status;
      }
    }
    else {
      bVar20 = 0;
    }
  }
  bVar21 = (this->_solReal).field_0xc8;
  (this->_solReal).field_0xc8 = bVar21 & 0xfe | bVar20;
  cVar19 = this->_isRealLPLoaded;
  bVar18 = cVar19 * '\x02';
  if (SVar17 != UNBOUNDED) {
    bVar18 = 0;
  }
  bVar18 = bVar21 & 0xfc | bVar20 | bVar18;
  (this->_solReal).field_0xc8 = bVar18;
  if (SVar17 == OPTIMAL) {
    bVar20 = bVar18 | 4;
    (this->_solReal).field_0xc8 = bVar20;
    bVar21 = 0;
  }
  else {
    if (((this->_solver).
         super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         .thestatus | UNBOUNDED) == INFEASIBLE) {
      local_d8.data._M_elems._32_8_ =
           *(undefined8 *)((this->_solver).theShift.m_backend.data._M_elems + 8);
      local_d8.data._M_elems._0_8_ = *(undefined8 *)(this->_solver).theShift.m_backend.data._M_elems
      ;
      local_d8.data._M_elems._8_8_ =
           *(undefined8 *)((this->_solver).theShift.m_backend.data._M_elems + 2);
      local_d8.data._M_elems._16_8_ =
           *(undefined8 *)((this->_solver).theShift.m_backend.data._M_elems + 4);
      local_d8.data._M_elems._24_8_ =
           *(undefined8 *)((this->_solver).theShift.m_backend.data._M_elems + 6);
      local_d8.exp = (this->_solver).theShift.m_backend.exp;
      local_d8.neg = (this->_solver).theShift.m_backend.neg;
      local_d8.fpclass = (this->_solver).theShift.m_backend.fpclass;
      local_d8.prec_elem = (this->_solver).theShift.m_backend.prec_elem;
      bVar20 = 0;
      if ((local_d8.fpclass != cpp_dec_float_NaN) &&
         (dVar6 = this->_currentSettings->_realParamValues[2] * 10.0, bVar20 = 0, !NAN(dVar6))) {
        local_68.fpclass = cpp_dec_float_finite;
        local_68.prec_elem = 10;
        local_68.data._M_elems[0] = 0;
        local_68.data._M_elems[1] = 0;
        local_68.data._M_elems[2] = 0;
        local_68.data._M_elems[3] = 0;
        local_68.data._M_elems[4] = 0;
        local_68.data._M_elems[5] = 0;
        local_68.data._M_elems._24_5_ = 0;
        local_68.data._M_elems[7]._1_3_ = 0;
        local_68.data._M_elems._32_5_ = 0;
        local_68.data._M_elems[9]._1_3_ = 0;
        local_68.exp = 0;
        local_68.neg = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&local_68,dVar6);
        iVar15 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&local_d8,&local_68);
        bVar20 = (byte)((uint)iVar15 >> 0x1d) & 4;
        bVar18 = (this->_solReal).field_0xc8;
        SVar17 = this->_status;
        cVar19 = this->_isRealLPLoaded;
      }
    }
    else {
      bVar20 = 0;
    }
    bVar20 = bVar18 & 0xfb | bVar20;
    (this->_solReal).field_0xc8 = bVar20;
    bVar21 = 0;
    if (SVar17 == INFEASIBLE) {
      bVar21 = cVar19 << 3;
    }
  }
  this_02 = &this->_solver;
  bVar21 = bVar20 & 0xf7 | bVar21;
  (this->_solReal).field_0xc8 = bVar21;
  if ((bVar18 & 2) != 0) {
    pVVar3 = &(this->_solReal)._primalRay;
    std::
    vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ::resize(&pVVar3->val,
             (long)(this->_solver).
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .
                   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .set.thenum);
    SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::getPrimalray(this_02,pVVar3);
    bVar21 = (this->_solReal).field_0xc8;
  }
  if ((bVar21 & 8) != 0) {
    pVVar3 = &(this->_solReal)._dualFarkas;
    std::
    vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ::resize(&pVVar3->val,
             (long)(this->_solver).
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .
                   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .set.thenum);
    SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::getDualfarkas(this_02,pVVar3);
  }
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::getBasis(this_02,(this->_basisStatusRows).data,(this->_basisStatusCols).data,
             (this->_basisStatusRows).thesize,(this->_basisStatusCols).thesize);
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::getPrimalSol(this_02,&this_00->_primal);
  local_90 = pVVar1;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::getSlacks(this_02,pVVar1);
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::getDualSol(this_02,this_01);
  local_98 = pVVar2;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::getRedCostSol(this_02,pVVar2);
  this->_hasBasis = true;
  pcVar16 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::zero();
  uVar7 = (pcVar16->data)._M_elems[1];
  uVar8 = (pcVar16->data)._M_elems[2];
  uVar9 = (pcVar16->data)._M_elems[3];
  uVar10 = (pcVar16->data)._M_elems[4];
  uVar11 = (pcVar16->data)._M_elems[5];
  uVar12 = (pcVar16->data)._M_elems[6];
  uVar13 = (pcVar16->data)._M_elems[7];
  (this->_solver).m_nonbasicValue.m_backend.data._M_elems[0] = (pcVar16->data)._M_elems[0];
  (this->_solver).m_nonbasicValue.m_backend.data._M_elems[1] = uVar7;
  (this->_solver).m_nonbasicValue.m_backend.data._M_elems[2] = uVar8;
  (this->_solver).m_nonbasicValue.m_backend.data._M_elems[3] = uVar9;
  (this->_solver).m_nonbasicValue.m_backend.data._M_elems[4] = uVar10;
  (this->_solver).m_nonbasicValue.m_backend.data._M_elems[5] = uVar11;
  (this->_solver).m_nonbasicValue.m_backend.data._M_elems[6] = uVar12;
  (this->_solver).m_nonbasicValue.m_backend.data._M_elems[7] = uVar13;
  *(undefined8 *)((this->_solver).m_nonbasicValue.m_backend.data._M_elems + 8) =
       *(undefined8 *)((pcVar16->data)._M_elems + 8);
  (this->_solver).m_nonbasicValue.m_backend.exp = pcVar16->exp;
  (this->_solver).m_nonbasicValue.m_backend.neg = pcVar16->neg;
  iVar14 = pcVar16->prec_elem;
  (this->_solver).m_nonbasicValue.m_backend.fpclass = pcVar16->fpclass;
  (this->_solver).m_nonbasicValue.m_backend.prec_elem = iVar14;
  (this->_solver).m_nonbasicValueUpToDate = false;
  (*(this->_solver).
    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[0x5e])(&local_68);
  *(ulong *)((this->_solReal)._objVal.m_backend.data._M_elems + 8) =
       CONCAT35(local_68.data._M_elems[9]._1_3_,local_68.data._M_elems._32_5_);
  *(undefined8 *)((this->_solReal)._objVal.m_backend.data._M_elems + 4) =
       local_68.data._M_elems._16_8_;
  *(ulong *)((this->_solReal)._objVal.m_backend.data._M_elems + 6) =
       CONCAT35(local_68.data._M_elems[7]._1_3_,local_68.data._M_elems._24_5_);
  *(undefined8 *)(this->_solReal)._objVal.m_backend.data._M_elems = local_68.data._M_elems._0_8_;
  *(undefined8 *)((this->_solReal)._objVal.m_backend.data._M_elems + 2) =
       local_68.data._M_elems._8_8_;
  (this->_solReal)._objVal.m_backend.exp = local_68.exp;
  (this->_solReal)._objVal.m_backend.neg = local_68.neg;
  (this->_solReal)._objVal.m_backend.fpclass = local_68.fpclass;
  (this->_solReal)._objVal.m_backend.prec_elem = local_68.prec_elem;
  this->_hasSolReal = true;
  if (((this->_solver).
       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ._isScaled == true) && (this->_isRealLPLoaded == false)) {
    _unscaleSolutionReal
              (this,&this_02->
                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ,false);
  }
  pVVar2 = local_90;
  pVVar1 = local_98;
  pSVar5 = this->_simplifier;
  if (pSVar5 == (SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)0x0) {
    if ((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         *)this->_realLP != this_02) {
      _loadRealLP(this,false);
    }
  }
  else {
    SVar4 = (this->_solver).
            super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .thestatus;
    (*pSVar5->_vptr_SPxSimplifier[6])
              (pSVar5,this_00,this_01,local_90,local_98,(this->_basisStatusRows).data,
               (this->_basisStatusCols).data,(ulong)(this->_status == OPTIMAL));
    iVar15 = (*this->_simplifier->_vptr_SPxSimplifier[9])();
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::operator=(&this_00->_primal,
                (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)CONCAT44(extraout_var,iVar15));
    iVar15 = (*this->_simplifier->_vptr_SPxSimplifier[0xb])();
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::operator=(pVVar2,(VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)CONCAT44(extraout_var_00,iVar15));
    iVar15 = (*this->_simplifier->_vptr_SPxSimplifier[10])();
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::operator=(this_01,(VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)CONCAT44(extraout_var_01,iVar15));
    iVar15 = (*this->_simplifier->_vptr_SPxSimplifier[0xc])();
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::operator=(pVVar1,(VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)CONCAT44(extraout_var_02,iVar15));
    (*this->_simplifier->_vptr_SPxSimplifier[0xf])
              (this->_simplifier,(this->_basisStatusRows).data,(this->_basisStatusCols).data,
               (ulong)(uint)(this->_basisStatusRows).thesize,
               (ulong)(uint)(this->_basisStatusCols).thesize);
    _loadRealLP(this,false);
    (this->_solver).weightsAreSetup = false;
    if ((this->_solver).m_status == OPTIMAL) {
      (this->_solver).m_status = UNKNOWN;
    }
    if (((this->_solver).
         super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         .thestatus != SVar4) &&
       ((this->_solver).
        super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .thestatus = SVar4, SVar4 == NO_PROBLEM)) {
      SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::invalidate(&(this->_solver).
                    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  );
    }
    SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::setBasis(this_02,(this->_basisStatusRows).data,(this->_basisStatusCols).data);
    this->_hasBasis = true;
  }
  if (this->_isRealLPScaled == true) {
    _unscaleSolutionReal(this,this->_realLP,true);
  }
  if (verify) {
    if (this->_status == ABORT_VALUE) {
      _verifyObjLimitReal(this);
    }
    else {
      _verifySolutionReal(this);
    }
  }
  return;
}

Assistant:

void SoPlexBase<R>::_storeSolutionReal(bool verify)
{
   // prepare storage for basis (enough to fit the original basis)
   _basisStatusRows.reSize(numRows());
   _basisStatusCols.reSize(numCols());

   // prepare storage for the solution data (only in transformed space due to unscaling), w/o setting it to zero
   _solReal._primal.reDim(_solver.nCols(), false);
   _solReal._slacks.reDim(_solver.nRows(), false);
   _solReal._dual.reDim(_solver.nRows(), false);
   _solReal._redCost.reDim(_solver.nCols(), false);

   // check primal status consistency and query solution status
   assert(_solver.basis().status() != SPxBasisBase<R>::PRIMAL || status() != SPxSolverBase<R>::ERROR);
   assert(_solver.basis().status() != SPxBasisBase<R>::PRIMAL
          || status() != SPxSolverBase<R>::NO_RATIOTESTER);
   assert(_solver.basis().status() != SPxBasisBase<R>::PRIMAL
          || status() != SPxSolverBase<R>::NO_PRICER);
   assert(_solver.basis().status() != SPxBasisBase<R>::PRIMAL
          || status() != SPxSolverBase<R>::NO_SOLVER);
   assert(_solver.basis().status() != SPxBasisBase<R>::PRIMAL
          || status() != SPxSolverBase<R>::NOT_INIT);
   assert(_solver.basis().status() != SPxBasisBase<R>::PRIMAL
          || status() != SPxSolverBase<R>::SINGULAR);
   assert(_solver.basis().status() != SPxBasisBase<R>::PRIMAL
          || status() != SPxSolverBase<R>::NO_PROBLEM);
   assert(_solver.basis().status() != SPxBasisBase<R>::PRIMAL
          || status() != SPxSolverBase<R>::UNBOUNDED);
   assert(_solver.basis().status() != SPxBasisBase<R>::PRIMAL
          || status() != SPxSolverBase<R>::INFEASIBLE);
   assert(_solver.basis().status() != SPxBasisBase<R>::UNBOUNDED
          || status() == SPxSolverBase<R>::UNBOUNDED);
   assert(_solver.basis().status() == SPxBasisBase<R>::UNBOUNDED
          || _solver.basis().status() == SPxBasisBase<R>::NO_PROBLEM
          || status() != SPxSolverBase<R>::UNBOUNDED);

   _solReal._isPrimalFeasible = (status() == SPxSolverBase<R>::OPTIMAL
                                 || ((_solver.basis().status() == SPxBasisBase<R>::PRIMAL
                                      || _solver.basis().status() == SPxBasisBase<R>::UNBOUNDED)
                                     && _solver.shift() < 10.0 * realParam(SoPlexBase<R>::EPSILON_ZERO)));

   _solReal._hasPrimalRay = (status() == SPxSolverBase<R>::UNBOUNDED && _isRealLPLoaded);

   // check dual status consistency and query solution status
   assert(_solver.basis().status() != SPxBasisBase<R>::DUAL || status() != SPxSolverBase<R>::ERROR);
   assert(_solver.basis().status() != SPxBasisBase<R>::DUAL
          || status() != SPxSolverBase<R>::NO_RATIOTESTER);
   assert(_solver.basis().status() != SPxBasisBase<R>::DUAL
          || status() != SPxSolverBase<R>::NO_PRICER);
   assert(_solver.basis().status() != SPxBasisBase<R>::DUAL
          || status() != SPxSolverBase<R>::NO_SOLVER);
   assert(_solver.basis().status() != SPxBasisBase<R>::DUAL || status() != SPxSolverBase<R>::NOT_INIT);
   assert(_solver.basis().status() != SPxBasisBase<R>::DUAL || status() != SPxSolverBase<R>::SINGULAR);
   assert(_solver.basis().status() != SPxBasisBase<R>::DUAL
          || status() != SPxSolverBase<R>::NO_PROBLEM);
   assert(_solver.basis().status() != SPxBasisBase<R>::DUAL
          || status() != SPxSolverBase<R>::UNBOUNDED);
   assert(_solver.basis().status() != SPxBasisBase<R>::DUAL
          || status() != SPxSolverBase<R>::INFEASIBLE);
   assert(_solver.basis().status() != SPxBasisBase<R>::INFEASIBLE
          || status() == SPxSolverBase<R>::INFEASIBLE);
   assert(_solver.basis().status() == SPxBasisBase<R>::INFEASIBLE
          || _solver.basis().status() == SPxBasisBase<R>::NO_PROBLEM
          || status() != SPxSolverBase<R>::INFEASIBLE);

   _solReal._isDualFeasible = (status() == SPxSolverBase<R>::OPTIMAL
                               || ((_solver.basis().status() == SPxBasisBase<R>::DUAL
                                    || _solver.basis().status() == SPxBasisBase<R>::INFEASIBLE)
                                   && _solver.shift() < 10.0 * realParam(SoPlexBase<R>::EPSILON_ZERO)));

   _solReal._hasDualFarkas = (status() == SPxSolverBase<R>::INFEASIBLE && _isRealLPLoaded);

   // get infeasibility or unboundedness proof if available
   if(_solReal._hasPrimalRay)
   {
      _solReal._primalRay.reDim(_solver.nCols(), false);
      _solver.getPrimalray(_solReal._primalRay);
   }

   if(_solReal._hasDualFarkas)
   {
      _solReal._dualFarkas.reDim(_solver.nRows(), false);
      _solver.getDualfarkas(_solReal._dualFarkas);
   }

   // get solution data from the solver; independent of solution status
   _solver.getBasis(_basisStatusRows.get_ptr(), _basisStatusCols.get_ptr(),
                    _basisStatusRows.size(), _basisStatusCols.size());

   _solver.getPrimalSol(_solReal._primal);
   _solver.getSlacks(_solReal._slacks);
   _solver.getDualSol(_solReal._dual);
   _solver.getRedCostSol(_solReal._redCost);

   _hasBasis = true;

   // get primal and/or dual objective function value depending on status
   _solver.forceRecompNonbasicValue();
   _solReal._objVal = _solver.objValue();

   // infeasible solutions shall also be stored and be accessible
   _hasSolReal = true;

   // unscale vectors
   if(_solver.isScaled() && !_isRealLPLoaded)
      _unscaleSolutionReal(_solver, false);

   // get unsimplified solution data from simplifier
   if(_simplifier)
   {
      assert(!_simplifier->isUnsimplified());
      assert(_simplifier->result() == SPxSimplifier<R>::OKAY);
      assert(_realLP != &_solver);

      typename SPxBasisBase<R>::SPxStatus simplifiedBasisStatus = _solver.getBasisStatus();

      try
      {
         // pass solution data of transformed problem to simplifier
         _simplifier->unsimplify(_solReal._primal, _solReal._dual, _solReal._slacks, _solReal._redCost,
                                 _basisStatusRows.get_ptr(), _basisStatusCols.get_ptr(), status() == SPxSolverBase<R>::OPTIMAL);
      }
      catch(const SPxException& E)
      {
         SPX_MSG_INFO1(spxout, spxout << "Caught exception <" << E.what() <<
                       "> during unsimplification. Resolving without simplifier and scaler.\n");
         _hasBasis = false;
         _preprocessAndSolveReal(false);
         return;
      }

      // copy unsimplified solution data from simplifier (size and dimension is adapted during copy)
      _solReal._primal  = _simplifier->unsimplifiedPrimal();
      _solReal._slacks  = _simplifier->unsimplifiedSlacks();
      _solReal._dual    = _simplifier->unsimplifiedDual();
      _solReal._redCost = _simplifier->unsimplifiedRedCost();

      // overwrite the transformed basis with the unsimplified one
      _simplifier->getBasis(_basisStatusRows.get_ptr(), _basisStatusCols.get_ptr(),
                            _basisStatusRows.size(), _basisStatusCols.size());

      // load original problem but don't setup a slack basis
      _loadRealLP(false);

      // since we presolved the problem, we should not allow access to the dual norms
      _solver.weightsAreSetup = false;

      assert(_realLP == &_solver);

      // reset basis status
      _solver.setBasisStatus(simplifiedBasisStatus);

      _solver.setBasis(_basisStatusRows.get_const_ptr(), _basisStatusCols.get_const_ptr());
      // load unsimplified basis into solver
      assert(_basisStatusRows.size() == numRows());
      assert(_basisStatusCols.size() == this->numCols());
      _hasBasis = true;
   }

   // load realLP into the solver again (internal scaling was applied)
   else if(_realLP != &_solver)
   {
      assert(_solver.isScaled());
      _loadRealLP(false);
   }

   // unscale stored solution (removes persistent scaling)
   if(_isRealLPScaled)
      _unscaleSolutionReal(*_realLP, true);

   // check solution for violations and solve again if necessary
   if(verify)
   {
      if(_status == SPxSolverBase<R>::ABORT_VALUE)
         _verifyObjLimitReal();
      else
         _verifySolutionReal();
   }

   assert(_solver.nCols() == this->numCols());
   assert(_solver.nRows() == numRows());
}